

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  ostream *poVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  char *str;
  char *in_RDX;
  Int32 IVar4;
  undefined1 auVar5 [8];
  string local_78;
  undefined1 local_58 [8];
  string env_var;
  Int32 local_2c [2];
  Int32 result;
  
  FlagToEnvVar_abi_cxx11_((string *)local_58,(internal *)flag,in_RDX);
  auVar5 = local_58;
  str = getenv((char *)local_58);
  IVar4 = default_value;
  if (str != (char *)0x0) {
    local_2c[0] = default_value;
    Message::Message((Message *)&local_78);
    _Var2._M_p = local_78._M_dataplus._M_p;
    poVar1 = (ostream *)(local_78._M_dataplus._M_p + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Environment variable ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(char *)local_58,(long)env_var._M_dataplus._M_p);
    bVar3 = ParseInt32((Message *)&local_78,str,local_2c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var2._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)_Var2._M_p + 8))(_Var2._M_p);
    }
    auVar5 = local_58;
    IVar4 = local_2c[0];
    if (!bVar3) {
      Message::Message((Message *)((long)&env_var.field_2 + 8));
      std::ostream::operator<<((ostream *)(env_var.field_2._8_8_ + 0x10),default_value);
      StringStreamToString(&local_78,(stringstream *)env_var.field_2._8_8_);
      printf("The default value %s is used.\n",local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (env_var.field_2._8_8_ != 0) {
        (**(code **)(*(long *)env_var.field_2._8_8_ + 8))(env_var.field_2._8_8_);
      }
      fflush(_stdout);
      auVar5 = local_58;
      IVar4 = default_value;
    }
  }
  if (auVar5 != (undefined1  [8])&env_var._M_string_length) {
    operator_delete((void *)auVar5,env_var._M_string_length + 1);
  }
  return IVar4;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
#if defined(GTEST_GET_INT32_FROM_ENV_)
  return GTEST_GET_INT32_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
#endif  // defined(GTEST_GET_INT32_FROM_ENV_)
}